

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O3

s32 __thiscall
irr::gui::CGUIFont::getKerningWidth(CGUIFont *this,wchar_t *thisLetter,wchar_t *previousLetter)

{
  _Rb_tree_header *p_Var1;
  wchar_t wVar2;
  pointer pSVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  u32 *puVar7;
  _Base_ptr p_Var8;
  
  if (thisLetter == (wchar_t *)0x0) {
    return this->GlobalKerningWidth;
  }
  p_Var8 = (this->CharacterMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->CharacterMap)._M_t._M_impl.super__Rb_tree_header;
  if (p_Var8 == (_Base_ptr)0x0) {
LAB_0021d734:
    puVar7 = &this->WrongCharacter;
  }
  else {
    wVar2 = *thisLetter;
    p_Var6 = &p_Var1->_M_header;
    p_Var5 = p_Var8;
    do {
      if (wVar2 <= (int)p_Var5[1]._M_color) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < wVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 == p_Var1) || (wVar2 < (int)p_Var6[1]._M_color))
    goto LAB_0021d734;
    puVar7 = (u32 *)&p_Var6[1].field_0x4;
  }
  pSVar3 = (this->Areas).m_data.
           super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = this->GlobalKerningWidth + pSVar3[*puVar7].overhang;
  if (previousLetter == (wchar_t *)0x0) {
    return iVar4;
  }
  if (p_Var8 != (_Base_ptr)0x0) {
    wVar2 = *previousLetter;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (wVar2 <= (int)p_Var8[1]._M_color) {
        p_Var5 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < wVar2];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((int)p_Var5[1]._M_color <= wVar2)) {
      puVar7 = (u32 *)&p_Var5[1].field_0x4;
      goto LAB_0021d780;
    }
  }
  puVar7 = &this->WrongCharacter;
LAB_0021d780:
  return iVar4 + pSVar3[*puVar7].underhang;
}

Assistant:

s32 CGUIFont::getKerningWidth(const wchar_t *thisLetter, const wchar_t *previousLetter) const
{
	s32 ret = GlobalKerningWidth;

	if (thisLetter) {
		ret += Areas[getAreaFromCharacter(*thisLetter)].overhang;

		if (previousLetter) {
			ret += Areas[getAreaFromCharacter(*previousLetter)].underhang;
		}
	}

	return ret;
}